

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::StringValue::ByteSizeLong(StringValue *this)

{
  size_type sVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  sVar1 = ((this->value_).ptr_)->_M_string_length;
  if (sVar1 == 0) {
    sVar3 = 0;
  }
  else {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar3;
    return sVar3;
  }
  sVar3 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar3,
                     &this->_cached_size_);
  return sVar3;
}

Assistant:

size_t StringValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.StringValue)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // string value = 1;
  if (this->value().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_value());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}